

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QObject * parentObject(QObject *obj)

{
  int iVar1;
  QLabel *pQVar2;
  char *pcVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QtPrivate::qobject_cast_helper<QLabel_const*,QObject_const>(obj);
  if (pQVar2 != (QLabel *)0x0) {
    (*(code *)**(undefined8 **)obj)(obj);
    pcVar3 = (char *)QMetaObject::className();
    iVar1 = qstrcmp(pcVar3,"QTipLabel");
    if (iVar1 == 0) {
      QObject::property((char *)&local_40);
      pQVar4 = qvariant_cast<QObject*>(&local_40);
      QVariant::~QVariant(&local_40);
      if (pQVar4 != (QObject *)0x0) goto LAB_0034241b;
    }
  }
  pQVar4 = *(QObject **)(*(long *)(obj + 8) + 0x10);
LAB_0034241b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

static inline QObject *parentObject(const QObject *obj)
{
#if QT_CONFIG(tooltip)
    if (qobject_cast<const QLabel *>(obj) && qstrcmp(obj->metaObject()->className(), "QTipLabel") == 0) {
        QObject *p = qvariant_cast<QObject *>(obj->property("_q_stylesheet_parent"));
        if (p)
            return p;
    }
#endif
    return obj->parent();
}